

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void lj_record_stop(jit_State *J,TraceLink linktype,TraceNo lnk)

{
  TraceNo1 TVar1;
  IRIns *pIVar2;
  uint uVar3;
  TRef TVar4;
  ulong uVar5;
  ulong uVar6;
  
  J->state = LJ_TRACE_END;
  (J->cur).linktype = (uint8_t)linktype;
  (J->cur).link = (TraceNo1)lnk;
  if (((J->cur).traceno == lnk) && (J->framedepth + J->retdepth == 0)) {
    if ((J->flags & 0x400000) != 0) goto LAB_0014db55;
    TVar1 = (J->cur).root;
    if (TVar1 != 0) {
      (J->cur).link = TVar1;
    }
  }
  uVar3 = (J->baseslot + J->maxslot) - 1;
  if (uVar3 != 0) {
    uVar6 = (ulong)uVar3;
    do {
      uVar5 = uVar6 - 1;
      uVar3 = J->slot[uVar6];
      if (((uVar3 >> 0x14 & 1) == 0) && ((uVar3 >> 0x18 & 0x1f) - 0xf < 5)) {
        pIVar2 = (J->cur).ir;
        if ((*(char *)((long)pIVar2 + (ulong)(uVar3 & 0xffff) * 8 + 5) != 'G') ||
           ((*(byte *)((long)pIVar2 + (ulong)(uVar3 & 0xffff) * 8 + 2) & 0x10) == 0)) {
          (J->fold).ins.field_0.op1 = (IRRef1)uVar3;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
          TVar4 = lj_opt_fold(J);
          J->slot[uVar6] = TVar4;
        }
      }
      uVar6 = uVar5;
    } while ((int)uVar5 != 0);
  }
LAB_0014db55:
  lj_snap_add(J);
  J->mergesnap = '\x01';
  J->needsnap = '\0';
  return;
}

Assistant:

void lj_record_stop(jit_State *J, TraceLink linktype, TraceNo lnk)
{
#ifdef LUAJIT_ENABLE_TABLE_BUMP
  if (J->retryrec)
    lj_trace_err(J, LJ_TRERR_RETRY);
#endif
  lj_trace_end(J);
  J->cur.linktype = (uint8_t)linktype;
  J->cur.link = (uint16_t)lnk;
  /* Looping back at the same stack level? */
  if (lnk == J->cur.traceno && J->framedepth + J->retdepth == 0) {
    if ((J->flags & JIT_F_OPT_LOOP))  /* Shall we try to create a loop? */
      goto nocanon;  /* Do not canonicalize or we lose the narrowing. */
    if (J->cur.root)  /* Otherwise ensure we always link to the root trace. */
      J->cur.link = J->cur.root;
  }
  canonicalize_slots(J);
nocanon:
  /* Note: all loop ops must set J->pc to the following instruction! */
  lj_snap_add(J);  /* Add loop snapshot. */
  J->needsnap = 0;
  J->mergesnap = 1;  /* In case recording continues. */
}